

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O3

vector<pstd::optional<std::pair<int,_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
* __thiscall
pstd::
vector<pstd::optional<std::pair<int,_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
::operator=(vector<pstd::optional<std::pair<int,_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
            *this,vector<pstd::optional<std::pair<int,_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
                  *other)

{
  uchar uVar1;
  optional<std::pair<int,_int>_> *poVar2;
  optional<std::pair<int,_int>_> *poVar3;
  size_t sVar4;
  long lVar5;
  bool *pbVar6;
  ulong uVar7;
  ulong uVar8;
  
  if (this != other) {
    if ((this->alloc).memoryResource == (other->alloc).memoryResource) {
      poVar2 = this->ptr;
      this->ptr = other->ptr;
      other->ptr = poVar2;
      sVar4 = this->nAlloc;
      this->nAlloc = other->nAlloc;
      other->nAlloc = sVar4;
      sVar4 = this->nStored;
      this->nStored = other->nStored;
      other->nStored = sVar4;
    }
    else {
      sVar4 = this->nStored;
      if (sVar4 != 0) {
        pbVar6 = &this->ptr->set;
        do {
          if (*pbVar6 == true) {
            *pbVar6 = false;
          }
          pbVar6 = pbVar6 + 0xc;
          sVar4 = sVar4 - 1;
        } while (sVar4 != 0);
      }
      this->nStored = 0;
      reserve(this,other->nStored);
      if (other->nStored == 0) {
        uVar8 = 0;
      }
      else {
        lVar5 = 8;
        uVar7 = 0;
        do {
          poVar2 = other->ptr;
          poVar3 = this->ptr;
          uVar1 = (poVar2->optionalValue).__data[lVar5];
          (poVar3->optionalValue).__data[lVar5] = uVar1;
          if ((uVar1 == '\x01') &&
             (*(undefined8 *)((long)poVar3 + lVar5 + -8) =
                   *(undefined8 *)((long)poVar2 + lVar5 + -8),
             (poVar2->optionalValue).__data[lVar5] == '\x01')) {
            (poVar2->optionalValue).__data[lVar5] = '\0';
          }
          uVar8 = other->nStored;
          uVar7 = uVar7 + 1;
          lVar5 = lVar5 + 0xc;
        } while (uVar7 < uVar8);
      }
      this->nStored = uVar8;
    }
  }
  return this;
}

Assistant:

vector &operator=(vector &&other) {
        if (this == &other)
            return *this;

        if (alloc == other.alloc) {
            pstd::swap(ptr, other.ptr);
            pstd::swap(nAlloc, other.nAlloc);
            pstd::swap(nStored, other.nStored);
        } else {
            clear();
            reserve(other.size());
            for (size_t i = 0; i < other.size(); ++i)
                alloc.template construct<T>(ptr + i, std::move(other[i]));
            nStored = other.size();
        }

        return *this;
    }